

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmdevice_p.h
# Opt level: O1

void __thiscall QEglFSKmsGbmDevice::~QEglFSKmsGbmDevice(QEglFSKmsGbmDevice *this)

{
  *(undefined ***)this = &PTR__QEglFSKmsGbmDevice_00130ac0;
  QEglFSKmsEventReader::~QEglFSKmsEventReader(&this->m_eventReader);
  QKmsDevice::~QKmsDevice((QKmsDevice *)this);
  operator_delete(this,0x70);
  return;
}

Assistant:

class Q_EGLFS_EXPORT QEglFSKmsGbmDevice: public QEglFSKmsDevice
{
public:
    QEglFSKmsGbmDevice(QKmsScreenConfig *screenConfig, const QString &path);

    bool open() override;
    void close() override;

    void *nativeDisplay() const override;
    gbm_device *gbmDevice() const;

    QPlatformCursor *globalCursor() const;
    void destroyGlobalCursor();
    void createGlobalCursor(QEglFSKmsGbmScreen *screen);

    QPlatformScreen *createScreen(const QKmsOutput &output) override;
    QPlatformScreen *createHeadlessScreen() override;
    void registerScreenCloning(QPlatformScreen *screen,
                               QPlatformScreen *screenThisScreenClones,
                               const QList<QPlatformScreen *> &screensCloningThisScreen) override;
    void registerScreen(QPlatformScreen *screen,
                        bool isPrimary,
                        const QPoint &virtualPos,
                        const QList<QPlatformScreen *> &virtualSiblings) override;

    bool usesEventReader() const;
    QEglFSKmsEventReader *eventReader() { return &m_eventReader; }

private:
    Q_DISABLE_COPY(QEglFSKmsGbmDevice)

    gbm_device *m_gbm_device;
    QEglFSKmsEventReader m_eventReader;
    QEglFSKmsGbmCursor *m_globalCursor;
}